

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps_alignment.c
# Opt level: O3

int ps_alignment_free(ps_alignment_t *al)

{
  int iVar1;
  int iVar2;
  
  iVar2 = 0;
  if (al != (ps_alignment_t *)0x0) {
    iVar1 = al->refcount;
    iVar2 = iVar1 + -1;
    al->refcount = iVar2;
    if (iVar1 < 2) {
      dict2pid_free(al->d2p);
      ckd_free((al->word).seq);
      ckd_free((al->sseq).seq);
      ckd_free((al->state).seq);
      ckd_free(al);
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

int
ps_alignment_free(ps_alignment_t *al)
{
    if (al == NULL)
        return 0;
    if (--al->refcount > 0)
        return al->refcount;
    dict2pid_free(al->d2p);
    ckd_free(al->word.seq);
    ckd_free(al->sseq.seq);
    ckd_free(al->state.seq);
    ckd_free(al);
    return 0;
}